

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::AddError(cmCursesMainForm *this,char *message,char *param_2)

{
  allocator local_41;
  value_type local_40;
  char *local_20;
  char *param_2_local;
  char *message_local;
  cmCursesMainForm *this_local;
  
  local_20 = param_2;
  param_2_local = message;
  message_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,message,&local_41);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Errors,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void cmCursesMainForm::AddError(const char* message, const char*)
{
  this->Errors.push_back(message);
}